

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

bool llvm::sys::path::has_extension(Twine *path,Style style)

{
  Style style_00;
  StringRef SVar1;
  StringRef path_00;
  undefined1 local_a0 [8];
  SmallString<128U> path_storage;
  
  local_a0 = (undefined1  [8])
             &path_storage.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
              super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
              super_SmallVectorBase.Size;
  style_00 = windows;
  path_storage.super_SmallVector<char,_128U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = (void *)0x8000000000;
  SVar1 = Twine::toStringRef(path,(SmallVectorImpl<char> *)local_a0);
  path_00.Length._0_4_ = style;
  path_00.Data = (char *)SVar1.Length;
  path_00.Length._4_4_ = 0;
  SVar1 = extension((path *)SVar1.Data,path_00,style_00);
  SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)local_a0);
  return SVar1.Length != 0;
}

Assistant:

bool has_extension(const Twine &path, Style style) {
  SmallString<128> path_storage;
  StringRef p = path.toStringRef(path_storage);

  return !extension(p, style).empty();
}